

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

bool __thiscall
testing::internal::CartesianProductGenerator<int,_bool>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::Equals
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this,
          ParamIteratorInterface<std::tuple<int,_bool>_> *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this_00;
  GTestLog local_1c;
  
  iVar2 = (*(this->super_ParamIteratorInterface<std::tuple<int,_bool>_>).
            _vptr_ParamIteratorInterface[2])();
  iVar3 = (*other->_vptr_ParamIteratorInterface[2])(other);
  bVar1 = IsTrue(CONCAT44(extraout_var,iVar2) == CONCAT44(extraout_var_00,iVar3));
  if (!bVar1) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                       ,0x371);
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Condition BaseGenerator() == other.BaseGenerator() failed. ");
    poVar4 = std::operator<<(poVar4,"The program attempted to compare iterators ");
    poVar4 = std::operator<<(poVar4,"from different generators.");
    std::endl<char,std::char_traits<char>>(poVar4);
    GTestLog::~GTestLog(&local_1c);
  }
  this_00 = CheckedDowncastToActualType<testing::internal::CartesianProductGenerator<int,bool>::IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul>>const,testing::internal::ParamIteratorInterface<std::tuple<int,bool>>const>
                      (other);
  bVar1 = AtEnd(this);
  if ((bVar1) && (bVar1 = AtEnd(this_00), bVar1)) {
    return true;
  }
  bVar1 = ParamIterator<int>::operator==
                    (&(this->current_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
                      .super__Head_base<0UL,_testing::internal::ParamIterator<int>,_false>.
                      _M_head_impl,
                     &(this_00->current_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
                      .super__Head_base<0UL,_testing::internal::ParamIterator<int>,_false>.
                      _M_head_impl);
  if (bVar1) {
    bVar1 = ParamIterator<bool>::operator==
                      ((ParamIterator<bool> *)&this->current_,
                       (ParamIterator<bool> *)&this_00->current_);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Equals(const ParamIteratorInterface<ParamType>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      const IteratorImpl* typed_other =
          CheckedDowncastToActualType<const IteratorImpl>(&other);

      // We must report iterators equal if they both point beyond their
      // respective ranges. That can happen in a variety of fashions,
      // so we have to consult AtEnd().
      if (AtEnd() && typed_other->AtEnd()) return true;

      bool same = true;
      bool dummy[] = {
          (same = same && std::get<I>(current_) ==
                              std::get<I>(typed_other->current_))...};
      (void)dummy;
      return same;
    }